

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall
cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>::detach
          (holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->mDat).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)&this->mDat;
      p_Var1 = p_Var1->_M_next) {
    cs::copy_no_return((var *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void detach() override
			{
				cs_impl::detach(mDat);
			}